

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O3

bool __thiscall spvtools::opt::LoopPeeling::IsConditionCheckSideEffectFree(LoopPeeling *this)

{
  IRContext *this_00;
  CFG *this_01;
  bool bVar1;
  char cVar2;
  uint32_t uVar3;
  uint32_t entry;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar4;
  BasicBlock *pBVar5;
  Instruction *pIVar6;
  LoopDescriptor *pLVar7;
  Instruction *pIVar8;
  __node_gen_type __node_gen;
  uint32_t condition_block_id;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  blocks_in_path;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_98;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  uint32_t local_6c;
  undefined1 local_68 [40];
  Loop *local_40;
  Instruction *pIStack_38;
  
  this_00 = this->context_;
  if ((this_00->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(this_00);
  }
  if (this->do_while_form_ == false) {
    this_01 = (this_00->cfg_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>.
              _M_t.
              super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
              .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
    pIVar6 = (this->loop_->loop_merge_->label_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    entry = 0;
    uVar3 = 0;
    if (pIVar6->has_result_id_ == true) {
      uVar3 = Instruction::GetSingleWordOperand(pIVar6,(uint)pIVar6->has_type_id_);
    }
    pvVar4 = CFG::preds(this_01,uVar3);
    local_6c = *(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
    local_68._0_8_ = &stack0xffffffffffffffc8;
    local_68._8_8_ = (IRContext *)0x1;
    local_68._16_8_ = (LoopDescriptor *)0x0;
    local_68._24_8_ = (Loop *)0x0;
    local_68._32_4_ = 1.0;
    local_40 = (Loop *)0x0;
    pIStack_38 = (Instruction *)0x0;
    local_90._M_unused._M_object = local_68;
    std::
    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
              (local_90._M_unused._M_object,
               (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&local_6c);
    uVar3 = local_6c;
    pIVar6 = (this->loop_->loop_header_->label_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    if (pIVar6->has_result_id_ == true) {
      entry = Instruction::GetSingleWordOperand(pIVar6,(uint)pIVar6->has_type_id_);
    }
    anon_unknown_27::GetBlocksInPath
              (uVar3,entry,
               (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)local_68,this_01);
    if ((LoopDescriptor *)local_68._16_8_ != (LoopDescriptor *)0x0) {
      pLVar7 = (LoopDescriptor *)local_68._16_8_;
      do {
        pBVar5 = CFG::block(this_01,*(uint32_t *)
                                     &(pLVar7->loops_).
                                      super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish);
        local_90._8_8_ = 0;
        local_78 = std::
                   _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:232:30)>
                   ::_M_invoke;
        local_80 = std::
                   _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:232:30)>
                   ::_M_manager;
        pIVar6 = (pBVar5->label_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        local_90._M_unused._M_object = this;
        if ((pIVar6 == (Instruction *)0x0) ||
           (local_98._M_head_impl = pIVar6,
           bVar1 = std::
                   _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:232:30)>
                   ::_M_invoke(&local_90,&local_98._M_head_impl), bVar1)) {
          pIVar6 = (pBVar5->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                   super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
          bVar1 = true;
          if ((pIVar6 != (Instruction *)0x0) &&
             ((pIVar6->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false))
          {
            do {
              bVar1 = pIVar6 == (Instruction *)0x0;
              if (bVar1) break;
              pIVar8 = (pIVar6->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
              local_98._M_head_impl = pIVar6;
              if (local_80 == (code *)0x0) {
                std::__throw_bad_function_call();
              }
              if ((pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ !=
                  false) {
                pIVar8 = (Instruction *)0x0;
              }
              cVar2 = (*local_78)(&local_90,&local_98);
              pIVar6 = pIVar8;
            } while (cVar2 != '\0');
          }
        }
        else {
          bVar1 = false;
        }
        if (local_80 != (code *)0x0) {
          (*local_80)(&local_90,&local_90,3);
        }
        if (!bVar1) {
          std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)local_68);
          return false;
        }
        pLVar7 = (LoopDescriptor *)
                 (pLVar7->loops_).
                 super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      } while (pLVar7 != (LoopDescriptor *)0x0);
    }
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_68);
  }
  return true;
}

Assistant:

bool LoopPeeling::IsConditionCheckSideEffectFree() const {
  CFG& cfg = *context_->cfg();

  // The "do-while" form does not cause issues, the algorithm takes into account
  // the first iteration.
  if (!do_while_form_) {
    uint32_t condition_block_id = cfg.preds(loop_->GetMergeBlock()->id())[0];

    std::unordered_set<uint32_t> blocks_in_path;

    blocks_in_path.insert(condition_block_id);
    GetBlocksInPath(condition_block_id, loop_->GetHeaderBlock()->id(),
                    &blocks_in_path, cfg);

    for (uint32_t bb_id : blocks_in_path) {
      BasicBlock* bb = cfg.block(bb_id);
      if (!bb->WhileEachInst([this](Instruction* insn) {
            if (insn->IsBranch()) return true;
            switch (insn->opcode()) {
              case spv::Op::OpLabel:
              case spv::Op::OpSelectionMerge:
              case spv::Op::OpLoopMerge:
                return true;
              default:
                break;
            }
            return context_->IsCombinatorInstruction(insn);
          })) {
        return false;
      }
    }
  }

  return true;
}